

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffdrow(fitsfile *fptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  char comm [73];
  long nblock;
  LONGLONG freespace;
  LONGLONG nshift;
  LONGLONG nbytes;
  LONGLONG firstbyte;
  LONGLONG datasize;
  LONGLONG naxis2;
  LONGLONG naxis1;
  fitsfile *in_stack_00000098;
  int tstatus;
  int *in_stack_00000a98;
  long in_stack_00000aa0;
  fitsfile *in_stack_00000aa8;
  int *in_stack_000185f8;
  LONGLONG in_stack_00018600;
  LONGLONG in_stack_00018608;
  LONGLONG in_stack_00018610;
  fitsfile *in_stack_00018618;
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  LONGLONG *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  long local_38;
  int local_4;
  
  if (*in_RCX < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(stack0x00000048,(int *)comm._64_8_), 0 < iVar1)) {
        return *in_RCX;
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffffb8,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
      ffpmsg((char *)0x1217d5);
      *in_RCX = 0xeb;
      local_4 = 0xeb;
    }
    else if (in_RDX < 0) {
      *in_RCX = 0x132;
      local_4 = 0x132;
    }
    else if (in_RDX == 0) {
      local_4 = *in_RCX;
    }
    else {
      ffgkyjj(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
              in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < in_RSI) {
        ffpmsg((char *)0x12189f);
        *in_RCX = 0x133;
        local_4 = 0x133;
      }
      else if (in_RSI < 1) {
        ffpmsg((char *)0x1218d4);
        *in_RCX = 0x133;
        local_4 = 0x133;
      }
      else if (*(long *)(*(long *)(in_RDI + 2) + 0x3c0) < in_RSI + in_RDX + -1) {
        ffpmsg((char *)0x12191c);
        *in_RCX = 0x133;
        local_4 = 0x133;
      }
      else {
        lVar2 = local_38 * in_RDX;
        lVar3 = *(long *)(*(long *)(in_RDI + 2) + 0x3d8) + *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
        ffshft(in_stack_00018618,in_stack_00018610,in_stack_00018608,in_stack_00018600,
               in_stack_000185f8);
        if (0 < (lVar2 + (((lVar3 + 0xb3f) / 0xb40) * 0xb40 - lVar3)) / 0xb40) {
          ffdblk(in_stack_00000aa8,in_stack_00000aa0,in_stack_00000a98);
        }
        *(long *)(*(long *)(in_RDI + 2) + 0x3d8) = *(long *)(*(long *)(in_RDI + 2) + 0x3d8) - lVar2;
        ffmkyj(stack0x00000048,(char *)comm._64_8_,comm._56_8_,(char *)comm._48_8_,
               (int *)comm._40_8_);
        ffmkyj(stack0x00000048,(char *)comm._64_8_,comm._56_8_,(char *)comm._48_8_,
               (int *)comm._40_8_);
        *(long *)(*(long *)(in_RDI + 2) + 0x3c0) = *(long *)(*(long *)(in_RDI + 2) + 0x3c0) - in_RDX
        ;
        *(long *)(*(long *)(in_RDI + 2) + 0x3b8) = *(long *)(*(long *)(in_RDI + 2) + 0x3b8) - in_RDX
        ;
        ffcmph(in_stack_00000098,(int *)naxis1);
        local_4 = *in_RCX;
      }
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffdrow(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG firstrow,   /* I - first row to delete (1 = first)          */
           LONGLONG nrows,      /* I - number of rows to delete                 */
           int *status)     /* IO - error status                            */
/*
 delete NROWS rows from table starting with firstrow (1 = first row of table).
*/
{
    int tstatus;
    LONGLONG naxis1, naxis2;
    LONGLONG datasize, firstbyte, nbytes, nshift;
    LONGLONG freespace;
    long nblock;
    char comm[FLEN_COMMENT];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrow)");
        return(*status = NOT_TABLE);
    }

    if (nrows < 0 )
        return(*status = NEG_BYTES);
    else if (nrows == 0)
        return(*status);   /* no op, so just return */

    ffgkyjj(fptr, "NAXIS1", &naxis1, comm, status); /* get the current   */

   /* ffgkyj(fptr, "NAXIS2", &naxis2, comm, status);*/ /* size of the table */

    /* the NAXIS2 keyword may not be up to date, so use the structure value */
    naxis2 = (fptr->Fptr)->numrows;

    if (firstrow > naxis2)
    {
        ffpmsg(
   "Delete position greater than the number of rows in the table (ffdrow)");
        return(*status = BAD_ROW_NUM);
    }
    else if (firstrow < 1)
    {
        ffpmsg("Delete position is less than 1 (ffdrow)");
        return(*status = BAD_ROW_NUM);
    }
    else if (firstrow + nrows - 1 > naxis2)
    {
        ffpmsg("No. of rows to delete exceeds size of table (ffdrow)");
        return(*status = BAD_ROW_NUM);
    }

    nshift = naxis1 * nrows;   /* no. of bytes to delete from table */
    /* cur size of data */
    datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;

    firstbyte = naxis1 * (firstrow + nrows - 1); /* relative del pos */
    nbytes = datasize - firstbyte;    /* no. of bytes to shift up */
    firstbyte += ((fptr->Fptr)->datastart);   /* absolute delete position */

    ffshft(fptr, firstbyte, nbytes,  nshift * (-1), status); /* shift data */

    freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;
    nblock = (long) ((nshift + freespace) / 2880);   /* number of blocks */

    /* delete integral number blocks */
    if (nblock > 0) 
        ffdblk(fptr, nblock, status);

    /* update the heap starting address */
    (fptr->Fptr)->heapstart -= nshift;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (long)(fptr->Fptr)->heapstart, "&", &tstatus);

    /* update the NAXIS2 keyword */
    ffmkyj(fptr, "NAXIS2", naxis2 - nrows, "&", status);
    ((fptr->Fptr)->numrows) -= nrows;
    ((fptr->Fptr)->origrows) -= nrows;

    /* Update the heap data, if any.  This will remove any orphaned data */
    /* that was only pointed to by the rows that have been deleted */
    ffcmph(fptr, status);
    return(*status);
}